

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.cc
# Opt level: O2

void __thiscall xemmai::t_fiber::t_internal::f_epoch_scan(t_internal *this)

{
  t_object ***ppptVar1;
  t_object **pptVar2;
  t_object *ptVar3;
  long lVar4;
  t_object **pptVar5;
  t_object **pptVar6;
  t_object **p2;
  t_object **p2_00;
  long in_FS_OFFSET;
  t_object **p1;
  anon_class_8_1_53bbeb80 increment;
  t_engine *engine;
  t_object **top1;
  t_object **top0;
  t_object **p0;
  t_object **local_70;
  pthread_mutex_t *local_68;
  t_engine **local_60;
  t_engine *local_58;
  t_object **local_50;
  t_object **local_48;
  t_engine *local_40;
  _Head_base<0UL,_xemmai::t_object_**,_false> local_38;
  
  pptVar2 = this->v_estack_last_used;
  p2 = (t_object **)
       (((long)this->v_estack_used -
         (long)(this->v_estack)._M_t.
               super___uniq_ptr_impl<xemmai::t_value<xemmai::t_pointer>,_std::default_delete<xemmai::t_value<xemmai::t_pointer>[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_xemmai::t_value<xemmai::t_pointer>_*,_std::default_delete<xemmai::t_value<xemmai::t_pointer>[]>_>
               .super__Head_base<0UL,_xemmai::t_value<xemmai::t_pointer>_*,_false>._M_head_impl >> 1
        ) + (long)this->v_estack_last_head);
  this->v_estack_last_used = p2;
  lVar4 = (long)this->v_stack_bottom - (long)this->v_stack_top;
  local_48 = (t_object **)((long)this->v_stack_copy - lVar4);
  pptVar6 = (t_object **)((long)this->v_stack_last_bottom - lVar4);
  p2_00 = this->v_stack_last_top;
  this->v_stack_last_top = pptVar6;
  local_58 = *(t_engine **)(in_FS_OFFSET + -0x60);
  local_68 = (pthread_mutex_t *)&(local_58->v_object__heap).v_mutex;
  local_50 = pptVar6;
  local_40 = local_58;
  std::mutex::lock((mutex *)&local_68->__data);
  local_38._M_head_impl =
       (this->v_estack_buffer)._M_t.
       super___uniq_ptr_impl<xemmai::t_object_*,_std::default_delete<xemmai::t_object_*[]>_>._M_t.
       super__Tuple_impl<0UL,_xemmai::t_object_**,_std::default_delete<xemmai::t_object_*[]>_>.
       super__Head_base<0UL,_xemmai::t_object_**,_false>._M_head_impl;
  ppptVar1 = &this->v_estack_decrements;
  this->v_estack_decrements = local_38._M_head_impl;
  local_70 = this->v_estack_last_head;
  pptVar5 = p2;
  if (pptVar2 < p2) {
    pptVar5 = pptVar2;
  }
  t_engine::f_epoch_increment(local_40,&local_38._M_head_impl,&local_70,pptVar5,ppptVar1);
  local_60 = &local_58;
  if (pptVar2 < p2) {
    f_epoch_scan()::$_0::operator()((__0 *)&local_60,&local_38._M_head_impl,&local_70,p2);
  }
  else {
    for (; local_70 < pptVar2; local_70 = local_70 + 1) {
      ptVar3 = *local_70;
      if (ptVar3 != (t_object *)0x0) {
        pptVar5 = *ppptVar1;
        *ppptVar1 = pptVar5 + 1;
        *pptVar5 = ptVar3;
      }
    }
  }
  ppptVar1 = &this->v_stack_decrements;
  this->v_stack_decrements = this->v_stack_last_bottom;
  if (pptVar6 < p2_00) {
    f_epoch_scan()::$_0::operator()((__0 *)&local_60,&local_48,&local_50,p2_00);
  }
  else {
    for (; p2_00 < pptVar6; p2_00 = p2_00 + 1) {
      ptVar3 = *p2_00;
      if (ptVar3 != (t_object *)0x0) {
        pptVar2 = *ppptVar1;
        *ppptVar1 = pptVar2 + 1;
        *pptVar2 = ptVar3;
      }
    }
  }
  t_engine::f_epoch_increment(local_58,&local_48,&local_50,this->v_stack_last_bottom,ppptVar1);
  pthread_mutex_unlock(local_68);
  return;
}

Assistant:

void t_fiber::t_internal::f_epoch_scan()
{
	auto used1 = v_estack_last_head + (v_estack_used - v_estack.get());
	auto used2 = v_estack_last_used;
	v_estack_last_used = used1;
	auto n = v_stack_bottom - v_stack_top;
	auto top0 = v_stack_copy - n;
	auto top1 = v_stack_last_bottom - n;
	auto top2 = v_stack_last_top;
	v_stack_last_top = top1;
	auto engine = f_engine();
	std::lock_guard lock(engine->v_object__heap.f_mutex());
	auto p0 = v_estack_decrements = v_estack_buffer.get();
	auto p1 = v_estack_last_head;
	engine->f_epoch_increment(p0, p1, std::min(used1, used2), v_estack_decrements);
	auto increment = [&](auto& p0, auto& p1, auto p2)
	{
		do {
			auto p = engine->f_object__find(*p0++);
			if (p) p->f_increment();
			*p1++ = p;
		} while (p1 < p2);
	};
	if (used1 > used2)
		increment(p0, p1, used1);
	else
		for (; p1 < used2; ++p1) if (*p1) *v_estack_decrements++ = *p1;
	v_stack_decrements = v_stack_last_bottom;
	if (top1 < top2)
		increment(top0, top1, top2);
	else
		for (; top2 < top1; ++top2) if (*top2) *v_stack_decrements++ = *top2;
	engine->f_epoch_increment(top0, top1, v_stack_last_bottom, v_stack_decrements);
}